

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborarray.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QCborArray *a)

{
  bool bVar1;
  QDebug *t;
  QCborContainerPrivate *v_00;
  QDebugStateSaver *this;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  const_iterator cVar2;
  QCborValueConstRef QVar3;
  QCborArray *__range1;
  char *comma;
  QCborValueConstRef v;
  const_iterator __end1;
  const_iterator __begin1;
  QDebugStateSaver saver;
  undefined7 in_stack_fffffffffffffef8;
  char in_stack_fffffffffffffeff;
  QCborValue *in_stack_ffffffffffffff00;
  ConstIterator *in_stack_ffffffffffffff08;
  QDebug *in_stack_ffffffffffffff18;
  QDebugStateSaver *in_stack_ffffffffffffff20;
  QDebug *in_stack_ffffffffffffff28;
  Stream *this_00;
  QDebug local_68 [2];
  QCborValueConstRef local_58;
  QCborValueConstRef local_48;
  ConstIterator local_38;
  undefined1 *local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QDebugStateSaver::QDebugStateSaver(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  t = QDebug::nospace(in_RSI);
  QDebug::operator<<(in_stack_ffffffffffffff28,(char *)t);
  local_38.item.d = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.item.i = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  cVar2 = QCborArray::begin((QCborArray *)0x4762ba);
  local_38.item.i = cVar2.item.i;
  v_00 = cVar2.item.d;
  local_48.d = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.i = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.item.d = v_00;
  QVar3 = (QCborValueConstRef)QCborArray::end((QCborArray *)0x4762f9);
  local_48 = QVar3;
  while( true ) {
    bVar1 = operator!=((ConstIterator *)in_stack_ffffffffffffff00,
                       (ConstIterator *)
                       CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
    if (!bVar1) break;
    local_58.d = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.i = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = QCborArray::ConstIterator::operator*(in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff08 = (ConstIterator *)QDebug::operator<<((QDebug *)QVar3.d,(char *)t);
    QDebug::QDebug(local_68,(QDebug *)in_stack_ffffffffffffff08);
    QCborValueConstRef::operator_cast_to_QCborValue
              ((QCborValueConstRef *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
    operator<<((QDebug *)in_RDI,(QCborValue *)v_00);
    QDebug::~QDebug((QDebug *)this_00);
    QCborValue::~QCborValue(in_stack_ffffffffffffff00);
    QDebug::~QDebug((QDebug *)this_00);
    QCborArray::ConstIterator::operator++(&local_38);
  }
  this = (QDebugStateSaver *)
         QDebug::operator<<((QDebug *)in_stack_ffffffffffffff00,in_stack_fffffffffffffeff);
  QDebug::QDebug((QDebug *)in_RDI,(QDebug *)this);
  QDebugStateSaver::~QDebugStateSaver(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QCborArray &a)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QCborArray{";
    const char *comma = "";
    for (auto v : a) {
        dbg << comma << v;
        comma = ", ";
    }
    return dbg << '}';
}